

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O0

void __thiscall cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this)

{
  size_type sVar1;
  size_type sVar2;
  long *in_RDI;
  uint local_10;
  VariableIndex local_c [3];
  
  sVar1 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                    ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 2));
  sVar2 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RDI[1]);
  if (sVar1 == sVar2) {
    sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                      ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RDI[1]);
    local_10 = (int)sVar1 - 1;
    VariableIndex::VariableIndex(local_c,&local_10);
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_c);
    return;
  }
  __assert_fail("nfxs.size() == cg.nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/exec.cc"
                ,0x50,"virtual void cnn::SimpleExecutionEngine::backward()");
}

Assistant:

void SimpleExecutionEngine::backward() {
  assert(nfxs.size() == cg.nodes.size());
  backward((VariableIndex)(cg.nodes.size()-1));
}